

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O1

bool __thiscall
duckdb::DuckTransaction::ShouldWriteToWAL(DuckTransaction *this,AttachedDatabase *db)

{
  bool bVar1;
  StorageManager *this_00;
  optional_ptr<duckdb::WriteAheadLog,_true> oVar2;
  
  bVar1 = ChangesMade(this);
  if ((bVar1) && (bVar1 = AttachedDatabase::IsSystem(db), !bVar1)) {
    this_00 = AttachedDatabase::GetStorageManager(db);
    oVar2 = StorageManager::GetWAL(this_00);
    return oVar2.ptr != (WriteAheadLog *)0x0;
  }
  return false;
}

Assistant:

bool DuckTransaction::ShouldWriteToWAL(AttachedDatabase &db) {
	if (!ChangesMade()) {
		return false;
	}
	if (db.IsSystem()) {
		return false;
	}
	auto &storage_manager = db.GetStorageManager();
	auto log = storage_manager.GetWAL();
	if (!log) {
		return false;
	}
	return true;
}